

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(Impl *this,Reader node)

{
  size_t amount;
  ArrayPtr<capnp::word> AVar1;
  ArrayPtr<capnp::word> AVar2;
  bool bVar3;
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> MVar4;
  Reader *reader;
  size_t sVar5;
  ushort uVar6;
  size_t unaff_R14;
  word *pwVar7;
  word *unaff_R15;
  ArrayPtr<capnp::word> uncheckedBuffer;
  ArrayPtr<capnp::word> AVar8;
  MessageSizeCounts MVar9;
  StructReader local_68;
  
  AVar1.size_ = unaff_R14;
  AVar1.ptr = unaff_R15;
  AVar8.size_ = unaff_R14;
  AVar8.ptr = unaff_R15;
  if ((node._reader.dataSize < 0x70) || (*(short *)((long)node._reader.data + 0xc) != 1))
  goto LAB_00213a56;
  local_68.segment = *node._reader.data;
  MVar4 = kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long>
                    (&this->structSizeRequirements,(unsigned_long *)&local_68);
  bVar3 = true;
  if (MVar4.ptr != (RequiredSize *)0x0) {
    if (node._reader.dataSize < 0x80) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)node._reader.data + 0xe);
    }
    if ((MVar4.ptr)->dataWordCount <= uVar6) {
      if (node._reader.dataSize < 0xd0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ushort *)((long)node._reader.data + 0x18);
      }
      AVar8 = AVar1;
      if ((MVar4.ptr)->pointerCount <= uVar6) goto LAB_00213a52;
    }
    AVar8 = rewriteStructNodeWithSizes
                      (this,node,(uint)(MVar4.ptr)->dataWordCount,(uint)(MVar4.ptr)->pointerCount);
    bVar3 = false;
  }
LAB_00213a52:
  if (!bVar3) {
    return AVar8;
  }
LAB_00213a56:
  local_68._32_8_ = node._reader._32_8_;
  local_68.nestingLimit = node._reader.nestingLimit;
  local_68._44_4_ = node._reader._44_4_;
  local_68.data = node._reader.data;
  local_68.pointers = node._reader.pointers;
  local_68.segment = node._reader.segment;
  local_68.capTable = node._reader.capTable;
  MVar9 = capnp::_::StructReader::totalSize(&local_68);
  amount = MVar9.wordCount * 8 + 8;
  pwVar7 = (word *)(MVar9.wordCount + 1);
  sVar5 = 0;
  reader = (Reader *)kj::Arena::allocateBytes(&this->arena,amount,8,false);
  AVar2.size_ = (size_t)pwVar7;
  AVar2.ptr = (word *)reader;
  memset(reader,0,amount);
  uncheckedBuffer.size_ = sVar5;
  uncheckedBuffer.ptr = pwVar7;
  copyToUnchecked<capnp::schema::Node::Reader&>((capnp *)&local_68,reader,uncheckedBuffer);
  return AVar2;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(
    schema::Node::Reader node) {
  if (node.isStruct()) {
    KJ_IF_MAYBE(requirement, structSizeRequirements.find(node.getId())) {
      auto structNode = node.getStruct();
      if (structNode.getDataWordCount() < requirement->dataWordCount ||
          structNode.getPointerCount() < requirement->pointerCount) {
        return rewriteStructNodeWithSizes(node, requirement->dataWordCount,
                                          requirement->pointerCount);
      }
    }
  }

  return makeUncheckedNode(node);
}